

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall tli_window_manager::TableBox::add(TableBox *this,Box *box,int row,int col)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  undefined4 extraout_var;
  int col_local;
  int row_local;
  Box *box_local;
  TableBox *this_local;
  
  pvVar2 = std::
           vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
           ::operator[](&this->table_,(long)row);
  pvVar3 = std::
           vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
           ::operator[](pvVar2,(long)col);
  if (pvVar3->first != (Box *)0x0) {
    (*pvVar3->first->_vptr_Box[4])();
  }
  iVar1 = (*box->_vptr_Box[2])();
  pvVar2 = std::
           vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
           ::operator[](&this->table_,(long)row);
  pvVar3 = std::
           vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
           ::operator[](pvVar2,(long)col);
  pvVar3->first = (Box *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void TableBox::add(Box *box, int row, int col) {
    delete table_[row][col].first;
    table_[row][col].first = box->clone();
}